

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

xmlDtdPtr xmlGetIntSubset(xmlDoc *doc)

{
  xmlDtdPtr pxVar1;
  
  if (doc == (xmlDoc *)0x0) {
    pxVar1 = (xmlDtdPtr)0x0;
  }
  else {
    pxVar1 = (xmlDtdPtr)doc->children;
    while( true ) {
      if (pxVar1 == (xmlDtdPtr)0x0) {
        return doc->intSubset;
      }
      if (pxVar1->type == XML_DTD_NODE) break;
      pxVar1 = (xmlDtdPtr)pxVar1->next;
    }
  }
  return pxVar1;
}

Assistant:

xmlDtdPtr
xmlGetIntSubset(const xmlDoc *doc) {
    xmlNodePtr cur;

    if (doc == NULL)
	return(NULL);
    cur = doc->children;
    while (cur != NULL) {
	if (cur->type == XML_DTD_NODE)
	    return((xmlDtdPtr) cur);
	cur = cur->next;
    }
    return((xmlDtdPtr) doc->intSubset);
}